

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_binary_unord_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  char (*in_stack_ffffffffffffff18) [2];
  char *op_local;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  op_local = op;
  bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op0);
  if (bVar1) {
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op1);
  }
  else {
    bVar1 = false;
  }
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_b0,&this->super_CompilerGLSL,op0,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_d0,&this->super_CompilerGLSL,op1,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_50,&this->super_CompilerGLSL,op0,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_70,&this->super_CompilerGLSL,op1,true);
  join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&local_90,(spirv_cross *)"(isunordered(",(char (*) [14])&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bed76,
             (char (*) [3])&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") || ",
             (char (*) [6])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2af68c,
             (char (*) [2])&op_local,(char **)0x2af68c,(char (*) [2])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
             in_stack_ffffffffffffff18);
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_90,bVar1,false);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  Compiler::inherit_expression_dependencies((Compiler *)this,result_id,op0);
  Compiler::inherit_expression_dependencies((Compiler *)this,result_id,op1);
  return;
}

Assistant:

void CompilerMSL::emit_binary_unord_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1);
	emit_op(result_type, result_id,
	        join("(isunordered(", to_enclosed_unpacked_expression(op0), ", ", to_enclosed_unpacked_expression(op1),
	             ") || ", to_enclosed_unpacked_expression(op0), " ", op, " ", to_enclosed_unpacked_expression(op1),
	             ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}